

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void __thiscall
Printer_printEmptyModel_Test::~Printer_printEmptyModel_Test(Printer_printEmptyModel_Test *this)

{
  Printer_printEmptyModel_Test *this_local;
  
  ~Printer_printEmptyModel_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Printer, printEmptyModel)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\"/>\n";
    libcellml::ModelPtr m = libcellml::Model::create();

    libcellml::PrinterPtr p = libcellml::Printer::create();

    const std::string a = p->printModel(m);

    EXPECT_EQ(e, a);
}